

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall
wirehair::Codec::ReconstructBlock(Codec *this,uint16_t block_id,void *block_out,uint32_t *bytes_out)

{
  bool bVar1;
  ushort uVar2;
  uint *in_RCX;
  void *in_RDX;
  ushort in_SI;
  uint *in_RDI;
  uint8_t *mix1_src;
  uint8_t *mix0_src;
  uint16_t peel_x;
  uint16_t peel_1;
  uint8_t *first;
  uint16_t peel_0;
  RowMixIterator mix;
  PeelRowIterator iter;
  PeelRowParameters params;
  uint32_t block_bytes;
  uint bytes;
  uint32_t id;
  uint16_t count;
  uint16_t row_i;
  uint8_t *src;
  PeelRow *row;
  int in_stack_000000cc;
  void *in_stack_000000d0;
  void *in_stack_000000d8;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  uint16_t distanceToP_1;
  uint16_t distanceToP_2;
  uint local_124;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined2 in_stack_fffffffffffffefe;
  ushort local_f2 [4];
  ushort local_ea;
  ushort local_e8;
  ushort local_e6;
  ushort local_e4;
  short local_e2;
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  ushort local_cc;
  ushort local_ca;
  long local_c8;
  long local_c0;
  uint *local_b8;
  undefined2 in_stack_ffffffffffffff5c;
  int bytes_00;
  uint *vy;
  undefined4 in_stack_ffffffffffffff68;
  WirehairResult WVar3;
  ushort uVar4;
  ushort uVar5;
  short *vz;
  uint local_4c;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  short *local_40;
  ushort *local_38;
  ushort local_30;
  ushort local_2c;
  ushort local_2a;
  ushort *local_28;
  ushort local_20;
  int in_stack_ffffffffffffffe4;
  ushort *in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  undefined2 in_stack_fffffffffffffff4;
  undefined2 in_stack_fffffffffffffff6;
  void *in_stack_fffffffffffffff8;
  
  bytes_00 = CONCAT22(in_SI,in_stack_ffffffffffffff5c);
  if ((in_RDX == (void *)0x0) || ((ushort)in_RDI[1] <= in_SI)) {
    *in_RCX = 0;
    WVar3 = Wirehair_InvalidInput;
  }
  else {
    local_b8 = in_RCX;
    if ((in_RDI[0x12] & 1) == 0) {
      local_d8 = *in_RDI;
      if ((uint)in_SI == (ushort)in_RDI[1] - 1) {
        local_d8 = in_RDI[0xf];
      }
      vy = in_RDI;
      PeelRowParameters::Initialize
                ((PeelRowParameters *)
                 CONCAT26(in_stack_fffffffffffffefe,
                          CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
                 (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffef0,
                 (uint16_t)((ulong)in_stack_fffffffffffffee8 >> 0x30),
                 (uint16_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      uVar5 = (ushort)in_RDI[1];
      uVar4 = *(ushort *)((long)in_RDI + 6);
      vz = &local_e2;
      local_ea = local_e0;
      local_e8 = local_de;
      local_42 = (ushort)in_RDI[6];
      local_44 = *(ushort *)((long)in_RDI + 0x1a);
      local_38 = local_f2;
      local_40 = &local_e2;
      local_46 = local_dc;
      local_f2[0] = local_dc;
      for (local_4c = 1; local_4c < 3; local_4c = local_4c + 1) {
        local_28 = &local_46;
        local_46 = (ushort)((ulong)((uint)local_46 + (uint)local_da) %
                           (ulong)(long)(int)(uint)local_44);
        if (local_42 <= local_46) {
          local_30 = local_44 - local_46;
          if (local_da < local_30) {
            local_46 = (ushort)(((uint)local_da * 0x10000 - (uint)local_30) % (uint)local_da);
          }
          else {
            local_46 = local_da - local_30;
          }
        }
        local_38[local_4c] = local_46;
        local_2c = local_44;
        local_2a = local_42;
      }
      if (local_e2 == 1) {
        bVar1 = false;
        local_f2[3] = 0;
      }
      else {
        local_f2[3] = local_e2 + -2;
        in_stack_ffffffffffffffe8 = &local_ea;
        in_stack_ffffffffffffffe4 = CONCAT22(uVar5,uVar4);
        local_ea = (ushort)((ulong)((uint)local_e0 + (uint)local_de) % (ulong)(long)(int)(uint)uVar4
                           );
        if (uVar5 <= local_e0) {
          local_20 = uVar4 - local_e0;
          if (local_de < local_20) {
            local_ea = (ushort)(((uint)local_de * 0x10000 - (uint)local_20) % (uint)local_de);
          }
          else {
            local_ea = local_de - local_20;
          }
        }
        bVar1 = true;
      }
      local_e6 = uVar5;
      local_e4 = uVar4;
      if (bVar1) {
        gf256_addset_mem(in_stack_fffffffffffffff8,
                         (void *)CONCAT26(in_stack_fffffffffffffff6,
                                          CONCAT24(in_stack_fffffffffffffff4,
                                                   CONCAT22(in_stack_fffffffffffffff2,
                                                            in_stack_fffffffffffffff0))),
                         in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
        while( true ) {
          if (local_f2[3] == 0) {
            bVar1 = false;
          }
          else {
            local_f2[3] = local_f2[3] + -1;
            uVar2 = (ushort)((ulong)((uint)local_ea + (uint)local_e8) %
                            (ulong)(long)(int)(uint)local_e4);
            if (local_e6 <= local_ea) {
              local_ea = local_e4 - local_ea;
              if (local_e8 < local_ea) {
                uVar2 = (ushort)(((uint)local_e8 * 0x10000 - (uint)local_ea) % (uint)local_e8);
              }
              else {
                uVar2 = local_e8 - local_ea;
              }
            }
            local_ea = uVar2;
            bVar1 = true;
          }
          if (!bVar1) break;
          gf256_add_mem(in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
        }
        gf256_add_mem(in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
      }
      else {
        gf256_addset_mem(in_stack_fffffffffffffff8,
                         (void *)CONCAT26(in_stack_fffffffffffffff6,
                                          CONCAT24(in_stack_fffffffffffffff4,
                                                   CONCAT22(in_stack_fffffffffffffff2,
                                                            in_stack_fffffffffffffff0))),
                         in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
      }
      gf256_add2_mem(vz,(void *)CONCAT26(uVar5,CONCAT24(uVar4,in_stack_ffffffffffffff68)),vy,
                     bytes_00);
      *local_b8 = local_d8;
      WVar3 = Wirehair_Success;
    }
    else {
      local_c0 = *(long *)(in_RDI + 0x18);
      local_c8 = *(long *)(in_RDI + 0xc);
      local_ca = 0;
      local_cc = *(ushort *)((long)in_RDI + 0x16);
      for (; local_ca < local_cc; local_ca = local_ca + 1) {
        local_d0 = *(uint *)(local_c0 + (ulong)local_ca * 0x18);
        if (local_d0 == in_SI) {
          if (local_d0 == (ushort)in_RDI[1] - 1) {
            local_124 = in_RDI[0xf];
          }
          else {
            local_124 = *in_RDI;
          }
          local_d4 = local_124;
          memcpy(in_RDX,(void *)(local_c8 + (ulong)((uint)local_ca * *in_RDI)),(ulong)local_124);
          *local_b8 = local_d4;
          return Wirehair_Success;
        }
      }
      WVar3 = Wirehair_Error;
    }
  }
  return WVar3;
}

Assistant:

WirehairResult Codec::ReconstructBlock(
    const uint16_t block_id, ///< Block identifier
    void * GF256_RESTRICT block_out, ///< Output block memory
    uint32_t* bytes_out ///< Bytes written to output
)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructBlock ----" << endl << endl;)

    // Validate input
    if (!block_out || block_id >= _block_count)
    {
        *bytes_out = 0;
        return Wirehair_InvalidInput;
    }

#if defined(CAT_ALL_ORIGINAL)
    // If decoder received only original data out of order:
    if (_all_original)
    {
        PeelRow * GF256_RESTRICT row = _peel_rows;
        const uint8_t * GF256_RESTRICT src = _input_blocks;

        // For each row that was received:
        for (uint16_t row_i = 0, count = _row_count; row_i < count; ++row_i)
        {
            const uint32_t id = row[row_i].RecoveryId;

            // If this is the id we seek:
            if (id == block_id)
            {
                CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

                const unsigned bytes = (id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

                memcpy(block_out, src + row_i * _block_bytes, bytes);

                *bytes_out = (uint32_t)bytes;

                return Wirehair_Success;
            }
        }

        return Wirehair_Error;
    }
#endif

    // Regenerate any single row that got lost:

    uint32_t block_bytes = _block_bytes;

    // For last row, use final byte count
    if (block_id == _block_count - 1) {
        block_bytes = _output_final_bytes;
    }

    CAT_IF_DUMP(cout << "Regenerating row " << block_id << ":";)

    PeelRowParameters params;
    params.Initialize(block_id, _p_seed, _block_count, _mix_count);

    PeelRowIterator iter(params, _block_count, _block_next_prime);
    const RowMixIterator mix(params, _mix_count, _mix_next_prime);

    const uint16_t peel_0 = iter.GetColumn();

    // Remember first column (there is always at least one)
    CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
    uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

    CAT_IF_DUMP(cout << " " << peel_0;)

    // If this row references multiple columns:
    if (iter.Iterate())
    {
        const uint16_t peel_1 = iter.GetColumn();

        CAT_IF_DUMP(cout << " " << peel_1;)

        CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);

        // Combine first two columns into output buffer (faster than memcpy + memxor)
        gf256_addset_mem(
            block_out,
            first,
            _recovery_blocks + _block_bytes * peel_1,
            block_bytes);

        // For each remaining peeler column:
        while (iter.Iterate())
        {
            const uint16_t peel_x = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_x;)

            CAT_DEBUG_ASSERT(peel_x < _recovery_rows);

            // Mix in each column
            gf256_add_mem(
                block_out,
                _recovery_blocks + _block_bytes * peel_x,
                block_bytes);
        }

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first mixer block in directly
        gf256_add_mem(
            block_out,
            _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]),
            block_bytes);
    }
    else
    {
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first with first mixer block (faster than memcpy + memxor)
        gf256_addset_mem(
            block_out,
            first,
            _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]),
            block_bytes);
    }

    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[0]);)

    // Combine remaining two mixer columns together:
    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
    const uint8_t * mix0_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[1]);)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
    const uint8_t * mix1_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[2]);)

    gf256_add2_mem(block_out, mix0_src, mix1_src, block_bytes);

    CAT_IF_DUMP(cout << endl;)

    *bytes_out = static_cast<uint32_t>(block_bytes);
    return Wirehair_Success;
}